

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O2

void __thiscall
embree::StringStream::StringStream
          (StringStream *this,Ref<embree::Stream<int>_> *cin,string *seps,string *endl,
          bool multiLine)

{
  Stream<int> *pSVar1;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Stream
            (&this->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)&PTR__StringStream_002a2360;
  pSVar1 = cin->ptr;
  (this->cin).ptr = pSVar1;
  if (pSVar1 != (Stream<int> *)0x0) {
    (*(pSVar1->super_RefCount)._vptr_RefCount[2])();
  }
  std::__cxx11::string::string((string *)&this->endl,(string *)endl);
  this->multiLine = multiLine;
  createCharMap(this->isSepMap,seps);
  createCharMap(this->isValidCharMap,(string *)stringChars_abi_cxx11_);
  return;
}

Assistant:

StringStream::StringStream(const Ref<Stream<int> >& cin, const std::string& seps, const std::string& endl, bool multiLine)
    : cin(cin), endl(endl), multiLine(multiLine)
  {
    createCharMap(isSepMap,seps);
    createCharMap(isValidCharMap,stringChars);
  }